

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O1

uint8_t __thiscall m6502::JSR(m6502 *this)

{
  byte bVar1;
  uint uVar2;
  size_t in_RCX;
  
  uVar2 = *(int *)&this->pc - 1;
  this->pc = (uint16_t)uVar2;
  write(this,this->stackPointer | 0x100,(void *)(ulong)(uVar2 >> 8 & 0xff),in_RCX);
  bVar1 = this->stackPointer - 1;
  this->stackPointer = bVar1;
  write(this,bVar1 | 0x100,(void *)(ulong)(byte)this->pc,in_RCX);
  this->stackPointer = this->stackPointer + 0xff;
  this->pc = this->addrAbs;
  return '\0';
}

Assistant:

uint8_t JSR()
  {
    --pc;
    write(0x0100u + stackPointer, (pc >> 8) & 0x00FFu);
    --stackPointer;
    write(0x0100u + stackPointer, pc & 0x00FFu);
    --stackPointer;
    pc = addrAbs;
    return 0;
  }